

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_strex(DisasContext_conflict1 *s,arg_STREX *a,MemOp mop,_Bool rel)

{
  int iVar1;
  int iVar2;
  int reg;
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *s_00;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  TCGv_i32 var;
  TCGLabel *l;
  TCGLabel *l_00;
  TCGv_i64 pTVar3;
  TCGv_i32 retv;
  TCGv_i32 newv;
  TCGv_i64 ret;
  TCGv_i64 dest;
  TCGv_i32 pTVar4;
  TCGv_i32 high;
  uint uVar5;
  TCGv_i32 low;
  uintptr_t o_1;
  uintptr_t o;
  MemOp op;
  uintptr_t o_2;
  
  iVar1 = a->rd;
  if ((((iVar1 != 0xf) && (a->rn != 0xf)) && (iVar2 = a->rt, iVar1 != iVar2)) &&
     ((iVar1 != a->rn && (iVar2 != 0xf)))) {
    tcg_ctx = s->uc->tcg_ctx;
    uVar5 = (uint)s->features & 0x8000200;
    if (((uVar5 == 0x8000000) || ((s->thumb == 0 || (iVar2 != 0xd && iVar1 != 0xd)))) &&
       ((mop != MO_64 ||
        ((iVar2 = a->rt2, iVar1 != iVar2 && iVar2 != 0xf &&
         (((uVar5 == 0x8000000 || (iVar2 != 0xd)) || (s->thumb == 0)))))))) {
      if (rel) {
        tcg_gen_mb_aarch64(tcg_ctx,TCG_BAR_STRL|TCG_MO_ALL);
      }
      var = tcg_temp_local_new_i32(tcg_ctx);
      load_reg_var(s,var,a->rn);
      tcg_gen_addi_i32_aarch64(tcg_ctx,var,var,a->imm);
      iVar1 = a->rd;
      iVar2 = a->rt;
      reg = a->rt2;
      s_00 = s->uc->tcg_ctx;
      op = s->be_data | mop | MO_ALIGN;
      l = gen_new_label_aarch64(s_00);
      l_00 = gen_new_label_aarch64(s_00);
      pTVar3 = tcg_temp_new_i64(s_00);
      tcg_gen_extu_i32_i64_aarch64(s_00,pTVar3,var);
      tcg_gen_brcond_i64_aarch64(s_00,TCG_COND_NE,pTVar3,s_00->cpu_exclusive_addr,l);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
      pTVar3 = gen_aa32_addr(s,var,op);
      retv = tcg_temp_new_i32(s_00);
      newv = load_reg(s,iVar2);
      if (mop == MO_64) {
        ret = tcg_temp_new_i64(s_00);
        dest = tcg_temp_new_i64(s_00);
        pTVar4 = load_reg(s,reg);
        high = pTVar4;
        low = newv;
        if (s->be_data == MO_BE) {
          high = newv;
          low = pTVar4;
        }
        tcg_gen_concat_i32_i64_aarch64(s_00,dest,low,high);
        tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar4 + (long)s_00));
        tcg_gen_atomic_cmpxchg_i64_aarch64
                  (s_00,ret,pTVar3,s_00->cpu_exclusive_val,dest,(ulong)(s->mmu_idx & 0xf),op);
        tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(dest + (long)s_00));
        tcg_gen_setcond_i64_aarch64(s_00,TCG_COND_NE,ret,ret,s_00->cpu_exclusive_val);
        tcg_gen_extrl_i64_i32_aarch64(s_00,retv,ret);
      }
      else {
        ret = (TCGv_i64)tcg_temp_new_i32(s_00);
        tcg_gen_extrl_i64_i32_aarch64(s_00,(TCGv_i32)ret,s_00->cpu_exclusive_val);
        tcg_gen_atomic_cmpxchg_i32_aarch64
                  (s_00,retv,pTVar3,(TCGv_i32)ret,newv,(ulong)(s->mmu_idx & 0xf),op);
        tcg_gen_setcond_i32_aarch64(s_00,TCG_COND_NE,retv,retv,(TCGv_i32)ret);
      }
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(newv + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
      tcg_gen_mov_i32(s_00,s_00->cpu_R[iVar1],retv);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(retv + (long)s_00));
      *(short *)&l_00->field_0x2 =
           (short)((uint)*(ushort *)&l_00->field_0x2 * 0x10000 + 0x10000 >> 0x10);
      tcg_gen_op1_aarch64(s_00,INDEX_op_br,(TCGArg)l_00);
      gen_set_label(s_00,l);
      tcg_gen_movi_i32(s_00,s_00->cpu_R[iVar1],1);
      gen_set_label(s_00,l_00);
      tcg_gen_movi_i64_aarch64(s_00,s_00->cpu_exclusive_addr,-1);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
      return (_Bool)extraout_AL_00;
    }
  }
  unallocated_encoding_aarch64(s);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_strex(DisasContext *s, arg_STREX *a, MemOp mop, bool rel)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr;
    /* Some cases stopped being UNPREDICTABLE in v8A (but not v8M) */
    bool v8a = ENABLE_ARCH_8 && !arm_dc_feature(s, ARM_FEATURE_M);

    /* We UNDEF for these UNPREDICTABLE cases.  */
    if (a->rd == 15 || a->rn == 15 || a->rt == 15
        || a->rd == a->rn || a->rd == a->rt
        || (!v8a && s->thumb && (a->rd == 13 || a->rt == 13))
        || (mop == MO_64
            && (a->rt2 == 15
                || a->rd == a->rt2
                || (!v8a && s->thumb && a->rt2 == 13)))) {
        unallocated_encoding(s);
        return true;
    }

    if (rel) {
        tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_STRL);
    }

    addr = tcg_temp_local_new_i32(tcg_ctx);
    load_reg_var(s, addr, a->rn);
    tcg_gen_addi_i32(tcg_ctx, addr, addr, a->imm);

    gen_store_exclusive(s, a->rd, a->rt, a->rt2, addr, mop);
    tcg_temp_free_i32(tcg_ctx, addr);
    return true;
}